

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OutputOptions.cpp
# Opt level: O0

bool __thiscall nvtt::OutputOptions::Private::openFile(Private *this)

{
  bool bVar1;
  int iVar2;
  DefaultOutputHandler *this_00;
  char *fileName;
  DefaultOutputHandler *oh;
  Private *this_local;
  
  bVar1 = nv::StringBuilder::isNull((StringBuilder *)this);
  if (!bVar1) {
    if ((this->outputHandler != (OutputHandler *)0x0) &&
       (iVar2 = nvAbort("outputHandler == __null",
                        "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/3rd party/nvtt/nvtt/OutputOptions.cpp"
                        ,0x50,"bool nvtt::OutputOptions::Private::openFile() const"), iVar2 == 1)) {
      raise(5);
    }
    this_00 = (DefaultOutputHandler *)operator_new(0x28);
    fileName = nv::StringBuilder::str((StringBuilder *)this);
    DefaultOutputHandler::DefaultOutputHandler(this_00,fileName);
    bVar1 = nv::StdStream::isError(&(this_00->stream).super_StdStream);
    if (bVar1) {
      return false;
    }
    this->outputHandler = (OutputHandler *)this_00;
  }
  return true;
}

Assistant:

bool OutputOptions::Private::openFile() const
{
	if (!fileName.isNull())
	{
		nvCheck(outputHandler == NULL);
		
		DefaultOutputHandler * oh = new DefaultOutputHandler(fileName.str());
		if (oh->stream.isError())
		{
			return false;
		}
		
		outputHandler = oh;
	}
	
	return true;
}